

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playermenu.cpp
# Opt level: O0

void __thiscall DPlayerMenu::PickPlayerClass(DPlayerMenu *this)

{
  uint uVar1;
  FPlayerClass *pFVar2;
  uint local_14;
  int pclass;
  DPlayerMenu *this_local;
  
  local_14 = 0;
  uVar1 = TArray<FPlayerClass,_FPlayerClass>::Size(&PlayerClasses);
  if ((1 < uVar1) &&
     (local_14 = userinfo_t::GetPlayerClassNum
                           ((userinfo_t *)((long)consoleplayer * 0x2a0 + 0x1ae70f8)),
     (int)local_14 < 0)) {
    local_14 = DMenu::MenuTime >> 7;
    uVar1 = TArray<FPlayerClass,_FPlayerClass>::Size(&PlayerClasses);
    local_14 = local_14 % uVar1;
  }
  this->PlayerClassIndex = local_14;
  pFVar2 = TArray<FPlayerClass,_FPlayerClass>::operator[]
                     (&PlayerClasses,(long)this->PlayerClassIndex);
  this->PlayerClass = pFVar2;
  UpdateTranslation(this);
  return;
}

Assistant:

void DPlayerMenu::PickPlayerClass()
{

	/*
	// What's the point of this? Aren't we supposed to edit the
	// userinfo?
	if (players[consoleplayer].mo != NULL)
	{
		PlayerClassIndex = players[consoleplayer].CurrentPlayerClass;
	}
	else
	*/
	{
		int pclass = 0;
		// [GRB] Pick a class from player class list
		if (PlayerClasses.Size () > 1)
		{
			pclass = players[consoleplayer].userinfo.GetPlayerClassNum();

			if (pclass < 0)
			{
				pclass = (MenuTime>>7) % PlayerClasses.Size ();
			}
		}
		PlayerClassIndex = pclass;
	}
	PlayerClass = &PlayerClasses[PlayerClassIndex];
	UpdateTranslation();
}